

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int idaLsSolve(IDAMem IDA_mem,N_Vector b,N_Vector weight,N_Vector ycur,N_Vector ypcur,
              N_Vector rescur)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  char *msgfmt;
  double dVar6;
  double local_40;
  
  piVar1 = (int *)IDA_mem->ida_lmem;
  if (piVar1 == (int *)0x0) {
    msgfmt = "Linear solver memory is NULL.";
    iVar4 = -2;
    iVar3 = 0x5a4;
    iVar2 = iVar4;
  }
  else {
    if (*piVar1 == 0) {
      local_40 = 0.0;
    }
    else {
      local_40 = *(double *)(piVar1 + 0x1c) * *(double *)(piVar1 + 0x1a) * IDA_mem->ida_epsNewt;
    }
    *(N_Vector *)(piVar1 + 0x12) = ycur;
    *(N_Vector *)(piVar1 + 0x14) = ypcur;
    *(N_Vector *)(piVar1 + 0x16) = rescur;
    if (*(long *)(*(long *)(*(long *)(piVar1 + 8) + 8) + 0x20) == 0) {
      if (*piVar1 != 0) {
        N_VConst(0x3ff0000000000000,*(undefined8 *)(piVar1 + 0x10));
        dVar6 = (double)N_VWrmsNorm(weight,*(undefined8 *)(piVar1 + 0x10));
        local_40 = local_40 / dVar6;
      }
    }
    else {
      iVar2 = SUNLinSolSetScalingVectors(*(long *)(piVar1 + 8),weight,weight);
      if (iVar2 != 0) {
        IDAProcessError(IDA_mem,-9,0x5c1,"idaLsSolve",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                        ,"Error in calling SUNLinSolSetScalingVectors");
        piVar1[0x3e] = -9;
        return -9;
      }
    }
    N_VConst(0,*(undefined8 *)(piVar1 + 0x10));
    iVar2 = SUNLinSolSetZeroGuess(*(undefined8 *)(piVar1 + 8),1);
    if (iVar2 != 0) {
      return -1;
    }
    if (*(code **)(piVar1 + 0x4a) != (code *)0x0) {
      iVar2 = (**(code **)(piVar1 + 0x4a))
                        (IDA_mem->ida_tn,IDA_mem->ida_cj,ycur,ypcur,rescur,
                         *(undefined8 *)(piVar1 + 0x50));
      piVar1[0x3e] = iVar2;
      *(long *)(piVar1 + 0x2c) = *(long *)(piVar1 + 0x2c) + 1;
      if (iVar2 != 0) {
        IDAProcessError(IDA_mem,0,0x5ed,"idaLsSolve",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                        ,"The Jacobian x vector setup routine failed in an unrecoverable manner.");
        return piVar1[0x3e];
      }
    }
    iVar3 = SUNLinSolSolve(local_40,*(undefined8 *)(piVar1 + 8),*(undefined8 *)(piVar1 + 10),
                           *(undefined8 *)(piVar1 + 0x10),b);
    if (*piVar1 == 0) {
      N_VScale(0x3ff0000000000000,*(undefined8 *)(piVar1 + 0x10),b);
    }
    else {
      iVar2 = SUNLinSolNumIters(*(undefined8 *)(piVar1 + 8));
      if ((iVar2 == 0) && (iVar4 = SUNLinSolGetType(*(undefined8 *)(piVar1 + 8)), iVar4 != 3)) {
        uVar5 = SUNLinSolResid(*(undefined8 *)(piVar1 + 8));
      }
      else {
        uVar5 = *(undefined8 *)(piVar1 + 0x10);
      }
      N_VScale(0x3ff0000000000000,uVar5,b);
      *(long *)(piVar1 + 0x24) = *(long *)(piVar1 + 0x24) + (long)iVar2;
    }
    if (piVar1[0x18] != 0) {
      dVar6 = IDA_mem->ida_cjratio;
      if ((dVar6 != 1.0) || (NAN(dVar6))) {
        N_VScale(2.0 / (dVar6 + 1.0),b,b);
      }
    }
    if (iVar3 == 0) {
      piVar1[0x3e] = 0;
      return 0;
    }
    *(long *)(piVar1 + 0x28) = *(long *)(piVar1 + 0x28) + 1;
    piVar1[0x3e] = iVar3;
    if ((iVar3 - 0x321U < 8) && ((0xf3U >> (iVar3 - 0x321U & 0x1f) & 1) != 0)) {
      return 1;
    }
    if (iVar3 + 9999U < 2) {
      return -1;
    }
    if (iVar3 + 0x32bU < 2) {
      return -1;
    }
    if (iVar3 == -0x2705) {
      return -1;
    }
    iVar2 = -1;
    if (iVar3 == -0x2703) {
      msgfmt = "Failure in SUNLinSol external package";
      iVar4 = -0x2703;
      iVar3 = 0x629;
    }
    else {
      if (iVar3 != -0x328) {
        return 0;
      }
      msgfmt = "The preconditioner solve routine failed in an unrecoverable manner.";
      iVar4 = -0x328;
      iVar3 = 0x62e;
    }
  }
  IDAProcessError(IDA_mem,iVar4,iVar3,"idaLsSolve",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int idaLsSolve(IDAMem IDA_mem, N_Vector b, N_Vector weight, N_Vector ycur,
               N_Vector ypcur, N_Vector rescur)
{
  IDALsMem idals_mem;
  int nli_inc, retval;
  sunrealtype tol, w_mean;

  /* access IDALsMem structure */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* If the linear solver is iterative: set convergence test constant tol,
     in terms of the Newton convergence test constant epsNewt and safety
     factors. The factor nrmlfac assures that the convergence test is
     applied to the WRMS norm of the residual vector, rather than the
     weighted L2 norm. */
  if (idals_mem->iterative)
  {
    tol = idals_mem->nrmfac * idals_mem->eplifac * IDA_mem->ida_epsNewt;
  }
  else { tol = ZERO; }

  /* Set vectors ycur, ypcur and rcur for use by the Atimes and
     Psolve interface routines */
  idals_mem->ycur  = ycur;
  idals_mem->ypcur = ypcur;
  idals_mem->rcur  = rescur;

  /* Set scaling vectors for LS to use (if applicable) */
  if (idals_mem->LS->ops->setscalingvectors)
  {
    retval = SUNLinSolSetScalingVectors(idals_mem->LS, weight, weight);
    if (retval != SUN_SUCCESS)
    {
      IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetScalingVectors");
      idals_mem->last_flag = IDALS_SUNLS_FAIL;
      return (idals_mem->last_flag);
    }

    /* If solver is iterative and does not support scaling vectors, update the
     tolerance in an attempt to account for weight vector.  We make the
     following assumptions:
       1. w_i = w_mean, for i=0,...,n-1 (i.e. the weights are homogeneous)
       2. the linear solver uses a basic 2-norm to measure convergence
     Hence (using the notation from sunlinsol_spgmr.h, with S = diag(w)),
           || bbar - Abar xbar ||_2 < tol
       <=> || S b - S A x ||_2 < tol
       <=> || S (b - A x) ||_2 < tol
       <=> \sum_{i=0}^{n-1} (w_i (b - A x)_i)^2 < tol^2
       <=> w_mean^2 \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2
       <=> \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2 / w_mean^2
       <=> || b - A x ||_2 < tol / w_mean
     So we compute w_mean = ||w||_RMS and scale the desired tolerance accordingly. */
  }
  else if (idals_mem->iterative)
  {
    N_VConst(ONE, idals_mem->x);
    w_mean = N_VWrmsNorm(weight, idals_mem->x);
    tol /= w_mean;
  }

  /* Set initial guess x = 0 to LS */
  N_VConst(ZERO, idals_mem->x);

  /* Set zero initial guess flag */
  retval = SUNLinSolSetZeroGuess(idals_mem->LS, SUNTRUE);
  if (retval != SUN_SUCCESS) { return (-1); }

  /* If a user-provided jtsetup routine is supplied, call that here */
  if (idals_mem->jtsetup)
  {
    idals_mem->last_flag = idals_mem->jtsetup(IDA_mem->ida_tn, ycur, ypcur,
                                              rescur, IDA_mem->ida_cj,
                                              idals_mem->jt_data);
    idals_mem->njtsetup++;
    if (idals_mem->last_flag != 0)
    {
      IDAProcessError(IDA_mem, retval, __LINE__, __func__, __FILE__,
                      MSG_LS_JTSETUP_FAILED);
      return (idals_mem->last_flag);
    }
  }

  /* Call solver */
  retval = SUNLinSolSolve(idals_mem->LS, idals_mem->J, idals_mem->x, b, tol);

  /* Copy appropriate result to b (depending on solver type) */
  if (idals_mem->iterative)
  {
    /* Retrieve solver statistics */
    nli_inc = SUNLinSolNumIters(idals_mem->LS);

    /* Copy x (or preconditioned residual vector if no iterations required) to b */
    if ((nli_inc == 0) &&
        (SUNLinSolGetType(idals_mem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED))
    {
      N_VScale(ONE, SUNLinSolResid(idals_mem->LS), b);
    }
    else { N_VScale(ONE, idals_mem->x, b); }

    /* Increment nli counter */
    idals_mem->nli += nli_inc;
  }
  else
  {
    /* Copy x to b */
    N_VScale(ONE, idals_mem->x, b);
  }

  /* If using a direct or matrix-iterative solver, scale the correction to
     account for change in cj */
  if (idals_mem->scalesol && (IDA_mem->ida_cjratio != ONE))
  {
    N_VScale(TWO / (ONE + IDA_mem->ida_cjratio), b, b);
  }

  /* Increment ncfl counter */
  if (retval != SUN_SUCCESS) { idals_mem->ncfl++; }

  /* Interpret solver return value  */
  idals_mem->last_flag = retval;

  switch (retval)
  {
  case SUN_SUCCESS: return (0); break;
  case SUNLS_RES_REDUCED:
  case SUNLS_CONV_FAIL:
  case SUNLS_PSOLVE_FAIL_REC:
  case SUNLS_PACKAGE_FAIL_REC:
  case SUNLS_QRFACT_FAIL:
  case SUNLS_LUFACT_FAIL: return (1); break;
  case SUN_ERR_ARG_CORRUPT:
  case SUN_ERR_ARG_INCOMPATIBLE:
  case SUN_ERR_MEM_FAIL:
  case SUNLS_GS_FAIL:
  case SUNLS_QRSOL_FAIL: return (-1); break;
  case SUN_ERR_EXT_FAIL:
    IDAProcessError(IDA_mem, SUN_ERR_EXT_FAIL, __LINE__, __func__, __FILE__,
                    "Failure in SUNLinSol external package");
    return (-1);
    break;
  case SUNLS_PSOLVE_FAIL_UNREC:
    IDAProcessError(IDA_mem, SUNLS_PSOLVE_FAIL_UNREC, __LINE__, __func__,
                    __FILE__, MSG_LS_PSOLVE_FAILED);
    return (-1);
    break;
  }

  return (0);
}